

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O2

void __thiscall xatlas::internal::Mesh::createColocals(Mesh *this)

{
  uint uVar1;
  Array<xatlas::internal::Vector3> *this_00;
  bool bVar2;
  Vector3 *pVVar3;
  AABB *pAVar4;
  uint *puVar5;
  Vector3 *v1;
  uint32_t i;
  uint uVar6;
  uint32_t index;
  uint uVar7;
  uint local_e0;
  uint32_t local_dc;
  Array<unsigned_int> *local_d8;
  Array<xatlas::internal::Vector3> *local_d0;
  Array<unsigned_int> colocals;
  Array<unsigned_int> potential;
  uint32_t otherVertex;
  Array<xatlas::internal::AABB> aabbs;
  BVH bvh;
  
  local_dc = (this->m_positions).m_base.size;
  aabbs.m_base.buffer = (uint8_t *)0x0;
  aabbs.m_base.elementSize = 0x18;
  aabbs.m_base.size = 0;
  aabbs.m_base.capacity = 0;
  Array<xatlas::internal::AABB>::resize(&aabbs,local_dc);
  local_d0 = &this->m_positions;
  for (uVar6 = 0; uVar6 < (this->m_positions).m_base.size; uVar6 = uVar6 + 1) {
    pVVar3 = Array<xatlas::internal::Vector3>::operator[](local_d0,uVar6);
    AABB::AABB((AABB *)&bvh,pVVar3,this->m_epsilon);
    pAVar4 = Array<xatlas::internal::AABB>::operator[](&aabbs,uVar6);
    *(Array<xatlas::internal::AABB> **)&pAVar4->min = bvh.m_objectAabbs;
    *(uint8_t **)&(pAVar4->min).z = bvh.m_objectIds.m_base.buffer;
    (pAVar4->max).y = (float)bvh.m_objectIds.m_base.elementSize;
    (pAVar4->max).z = (float)bvh.m_objectIds.m_base.size;
  }
  BVH::BVH(&bvh,&aabbs,4);
  colocals.m_base.buffer = (uint8_t *)0x0;
  colocals.m_base.elementSize = 4;
  colocals.m_base.size = 0;
  colocals.m_base.capacity = 0;
  potential.m_base.buffer = (uint8_t *)0x0;
  potential.m_base.elementSize = 4;
  potential.m_base.size = 0;
  potential.m_base.capacity = 0;
  this->m_colocalVertexCount = 0;
  local_d8 = &this->m_nextColocalVertex;
  Array<unsigned_int>::resize(local_d8,local_dc);
  for (index = 0; local_dc != index; index = index + 1) {
    puVar5 = Array<unsigned_int>::operator[](local_d8,index);
    *puVar5 = 0xffffffff;
  }
  local_e0 = 0;
  do {
    if (local_dc <= local_e0) {
      ArrayBase::~ArrayBase(&potential.m_base);
      ArrayBase::~ArrayBase(&colocals.m_base);
      BVH::~BVH(&bvh);
      ArrayBase::~ArrayBase(&aabbs.m_base);
      return;
    }
    puVar5 = Array<unsigned_int>::operator[](local_d8,local_e0);
    if (*puVar5 == 0xffffffff) {
      colocals.m_base._8_8_ = colocals.m_base._8_8_ & 0xffffffff;
      ArrayBase::push_back(&colocals.m_base,(uint8_t *)&local_e0);
      pVVar3 = Array<xatlas::internal::Vector3>::operator[](local_d0,local_e0);
      AABB::AABB((AABB *)&otherVertex,pVVar3,this->m_epsilon);
      BVH::query(&bvh,(AABB *)&otherVertex,&potential);
      for (uVar6 = 0; uVar1 = local_e0, uVar6 < potential.m_base.size; uVar6 = uVar6 + 1) {
        puVar5 = Array<unsigned_int>::operator[](&potential,uVar6);
        this_00 = local_d0;
        otherVertex = *puVar5;
        if (otherVertex != local_e0) {
          pVVar3 = Array<xatlas::internal::Vector3>::operator[](local_d0,local_e0);
          v1 = Array<xatlas::internal::Vector3>::operator[](this_00,otherVertex);
          bVar2 = equal(pVVar3,v1,this->m_epsilon);
          if (bVar2) {
            puVar5 = Array<unsigned_int>::operator[](local_d8,otherVertex);
            if (*puVar5 == 0xffffffff) {
              ArrayBase::push_back(&colocals.m_base,(uint8_t *)&otherVertex);
            }
          }
        }
      }
      if (colocals.m_base.size == 1) {
        puVar5 = Array<unsigned_int>::operator[](local_d8,local_e0);
        *puVar5 = uVar1;
      }
      else {
        this->m_colocalVertexCount = this->m_colocalVertexCount + colocals.m_base.size;
        insertionSort<unsigned_int>((uint *)colocals.m_base.buffer,colocals.m_base.size);
        uVar6 = 0;
        while (uVar6 < colocals.m_base.size) {
          uVar1 = uVar6 + 1;
          uVar7 = uVar1;
          if (uVar1 == colocals.m_base.size) {
            uVar7 = 0;
          }
          puVar5 = Array<unsigned_int>::operator[](&colocals,uVar7);
          uVar7 = *puVar5;
          puVar5 = Array<unsigned_int>::operator[](&colocals,uVar6);
          puVar5 = Array<unsigned_int>::operator[](local_d8,*puVar5);
          *puVar5 = uVar7;
          uVar6 = uVar1;
        }
        puVar5 = Array<unsigned_int>::operator[](local_d8,local_e0);
        if (*puVar5 == 0xffffffff) {
          __assert_fail("m_nextColocalVertex[i] != (4294967295U)",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                        ,0x9d8,"void xatlas::internal::Mesh::createColocals()");
        }
      }
    }
    local_e0 = local_e0 + 1;
  } while( true );
}

Assistant:

void createColocals()
	{
		const uint32_t vertexCount = m_positions.size();
		Array<AABB> aabbs(MemTag::BVH);
		aabbs.resize(vertexCount);
		for (uint32_t i = 0; i < m_positions.size(); i++)
			aabbs[i] = AABB(m_positions[i], m_epsilon);
		BVH bvh(aabbs);
		Array<uint32_t> colocals(MemTag::MeshColocals);
		Array<uint32_t> potential(MemTag::MeshColocals);
		m_colocalVertexCount = 0;
		m_nextColocalVertex.resize(vertexCount);
		for (uint32_t i = 0; i < vertexCount; i++)
			m_nextColocalVertex[i] = UINT32_MAX;
		for (uint32_t i = 0; i < vertexCount; i++) {
			if (m_nextColocalVertex[i] != UINT32_MAX)
				continue; // Already linked.
			// Find other vertices colocal to this one.
			colocals.clear();
			colocals.push_back(i); // Always add this vertex.
			bvh.query(AABB(m_positions[i], m_epsilon), potential);
			for (uint32_t j = 0; j < potential.size(); j++) {
				const uint32_t otherVertex = potential[j];
				if (otherVertex != i && equal(m_positions[i], m_positions[otherVertex], m_epsilon) && m_nextColocalVertex[otherVertex] == UINT32_MAX)
					colocals.push_back(otherVertex);
			}
			if (colocals.size() == 1) {
				// No colocals for this vertex.
				m_nextColocalVertex[i] = i;
				continue; 
			}
			m_colocalVertexCount += colocals.size();
			// Link in ascending order.
			insertionSort(colocals.data(), colocals.size());
			for (uint32_t j = 0; j < colocals.size(); j++)
				m_nextColocalVertex[colocals[j]] = colocals[(j + 1) % colocals.size()];
			XA_DEBUG_ASSERT(m_nextColocalVertex[i] != UINT32_MAX);
		}
	}